

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O0

bool anon_unknown.dwarf_146be24::hasSameDims(Type *left,Type *right)

{
  bitwidth_t bVar1;
  bitwidth_t bVar2;
  ConstantRange right_00;
  Type *pTVar3;
  Type *pTVar4;
  Type *in_RSI;
  Type *re;
  Type *le;
  Type *in_stack_ffffffffffffffb8;
  Type *in_stack_ffffffffffffffc8;
  undefined1 local_1;
  
  right_00 = slang::ast::Type::getFixedRange(in_stack_ffffffffffffffb8);
  bVar1 = slang::ConstantRange::width((ConstantRange *)0x9edf97);
  slang::ast::Type::getFixedRange(in_stack_ffffffffffffffb8);
  bVar2 = slang::ConstantRange::width((ConstantRange *)0x9edfb4);
  if (bVar1 == bVar2) {
    pTVar3 = slang::ast::Type::getArrayElementType(in_stack_ffffffffffffffc8);
    pTVar4 = slang::ast::Type::getArrayElementType(in_stack_ffffffffffffffc8);
    if ((pTVar3 != (Type *)0x0) == (pTVar4 != (Type *)0x0)) {
      if (pTVar3 == (Type *)0x0) {
        local_1 = true;
      }
      else {
        local_1 = hasSameDims(in_RSI,(Type *)right_00);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool hasSameDims(const Type& left, const Type& right) {
    if (left.getFixedRange().width() != right.getFixedRange().width())
        return false;

    auto le = left.getArrayElementType();
    auto re = right.getArrayElementType();
    if (bool(le) != bool(re))
        return false;

    if (!le)
        return true;

    return hasSameDims(*le, *re);
}